

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_float_with_real(void)

{
  undefined1 local_28b;
  undefined1 local_28a [2];
  undefined1 local_288 [8];
  variable number_3;
  undefined1 local_24b;
  undefined1 local_24a [2];
  undefined1 local_248 [8];
  variable data_5;
  undefined1 local_20b;
  undefined1 local_20a [2];
  undefined1 local_208 [8];
  variable number_2;
  undefined1 local_1cb;
  undefined1 local_1ca [2];
  undefined1 local_1c8 [8];
  variable data_4;
  undefined1 local_18e;
  undefined1 local_18d [2];
  undefined1 local_18b;
  undefined1 local_18a [2];
  undefined1 local_188 [8];
  variable data_3;
  undefined1 local_14b;
  undefined1 local_14a [2];
  undefined1 local_148 [8];
  variable number_1;
  undefined1 local_10b;
  undefined1 local_10a [2];
  undefined1 local_108 [8];
  variable data_2;
  undefined1 local_cb;
  undefined1 local_ca [2];
  undefined1 local_c8 [8];
  variable number;
  undefined1 local_8b;
  undefined1 local_8a [2];
  undefined1 local_88 [8];
  variable data_1;
  undefined1 local_4f;
  undefined1 local_4e [19];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xeb6,"void assign_suite::assign_float_with_real()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_38,1.0);
  local_4e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xeb8,"void assign_suite::assign_float_with_real()",local_4e,&local_4f);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_88,3.0);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_88);
  local_8b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xebc,"void assign_suite::assign_float_with_real()",local_8a,&local_8b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_c8,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_88,
             (basic_variable<std::allocator<char>_> *)local_c8);
  local_ca[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_88);
  local_cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xebf,"void assign_suite::assign_float_with_real()",local_ca,&local_cb);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_108,3.0);
  local_10a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_108);
  local_10b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xec3,"void assign_suite::assign_float_with_real()",local_10a,&local_10b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_148,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_108,
             (basic_variable<std::allocator<char>_> *)local_148);
  local_14a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_108);
  local_14b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xec6,"void assign_suite::assign_float_with_real()",local_14a,&local_14b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_188,3.0);
  local_18a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_188);
  local_18b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xeca,"void assign_suite::assign_float_with_real()",local_18a,&local_18b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_188,(longdouble)1);
  local_18d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_188);
  local_18e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xecc,"void assign_suite::assign_float_with_real()",local_18d,&local_18e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_1c8,3.0);
  local_1ca[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_1c8);
  local_1cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xed0,"void assign_suite::assign_float_with_real()",local_1ca,&local_1cb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_208,(longdouble)1);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_1c8,
             (basic_variable<std::allocator<char>_> *)local_208);
  local_20a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_1c8);
  local_20b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xed3,"void assign_suite::assign_float_with_real()",local_20a,&local_20b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_248,3.0);
  local_24a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_248);
  local_24b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xed7,"void assign_suite::assign_float_with_real()",local_24a,&local_24b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_288,(longdouble)1);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_248,
             (basic_variable<std::allocator<char>_> *)local_288);
  local_28a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_248);
  local_28b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xeda,"void assign_suite::assign_float_with_real()",local_28a,&local_28b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248);
  return;
}

Assistant:

void assign_float_with_real()
{
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        data = 1.0;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        variable number(1.0);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        variable number(1.0);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        data = 1.0L;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), true);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        variable number(1.0L);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), true);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        variable number(1.0L);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), true);
    }
}